

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_sizeof(lua_State *L)

{
  CTypeID id;
  CTSize CVar1;
  CType *ct;
  ulong uVar2;
  CTState *cts;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  if (((L->base->field_2).it == 0xfffffff5) &&
     (uVar2 = (ulong)(L->base->u32).lo, *(char *)(uVar2 + 4) < '\0')) {
    CVar1 = *(CTSize *)(uVar2 - 4);
LAB_00146acb:
    L->top[-1].n = (double)(int)CVar1;
  }
  else {
    ct = lj_ctype_rawref(cts,id);
    if ((ct->info & 0xd0100000) == 0x10100000) {
      CVar1 = ffi_checkint(L,2);
      CVar1 = lj_ctype_vlsize(cts,ct,CVar1);
LAB_00146ac6:
      if (CVar1 != 0xffffffff) goto LAB_00146acb;
    }
    else if (ct->info < 0x60000000) {
      CVar1 = ct->size;
      goto LAB_00146ac6;
    }
    *(undefined4 *)((long)L->top + -4) = 0xffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_sizeof)	LJLIB_REC(ffi_xof FF_ffi_sizeof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz;
  if (LJ_UNLIKELY(tviscdata(L->base) && cdataisv(cdataV(L->base)))) {
    sz = cdatavlen(cdataV(L->base));
  } else {
    CType *ct = lj_ctype_rawref(cts, id);
    if (ctype_isvltype(ct->info))
      sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
    else
      sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_INVALID;
    if (LJ_UNLIKELY(sz == CTSIZE_INVALID)) {
      setnilV(L->top-1);
      return 1;
    }
  }
  setintV(L->top-1, (int32_t)sz);
  return 1;
}